

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O1

void jpeg_set_defaults(j_compress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  JHUFF_TBL **htblptr;
  jpeg_component_info *pjVar3;
  JHUFF_TBL **htblptr_00;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x14;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->comp_info == (jpeg_component_info *)0x0) {
    pjVar3 = (jpeg_component_info *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x3c0);
    cinfo->comp_info = pjVar3;
  }
  cinfo->data_precision = 8;
  jpeg_add_quant_table(cinfo,0,std_luminance_quant_tbl,0x32,1);
  jpeg_add_quant_table(cinfo,1,std_chrominance_quant_tbl,0x32,1);
  htblptr_00 = (JHUFF_TBL **)&cinfo->optimize_coding;
  htblptr = (JHUFF_TBL **)(cinfo->arith_ac_K + 8);
  if (cinfo->is_decompressor == 0) {
    htblptr_00 = cinfo->ac_huff_tbl_ptrs;
    htblptr = cinfo->dc_huff_tbl_ptrs;
  }
  add_huff_table((j_common_ptr)cinfo,htblptr,std_huff_tables_bits_dc_luminance,
                 std_huff_tables_val_dc_luminance);
  add_huff_table((j_common_ptr)cinfo,htblptr_00,std_huff_tables_bits_ac_luminance,
                 std_huff_tables_val_ac_luminance);
  add_huff_table((j_common_ptr)cinfo,htblptr + 1,std_huff_tables_bits_dc_chrominance,
                 std_huff_tables_val_dc_chrominance);
  add_huff_table((j_common_ptr)cinfo,htblptr_00 + 1,std_huff_tables_bits_ac_chrominance,
                 std_huff_tables_val_ac_chrominance);
  cinfo->arith_dc_L[0] = '\0';
  cinfo->arith_dc_L[1] = '\0';
  cinfo->arith_dc_L[2] = '\0';
  cinfo->arith_dc_L[3] = '\0';
  cinfo->arith_dc_L[4] = '\0';
  cinfo->arith_dc_L[5] = '\0';
  cinfo->arith_dc_L[6] = '\0';
  cinfo->arith_dc_L[7] = '\0';
  cinfo->arith_dc_L[8] = '\0';
  cinfo->arith_dc_L[9] = '\0';
  cinfo->arith_dc_L[10] = '\0';
  cinfo->arith_dc_L[0xb] = '\0';
  cinfo->arith_dc_L[0xc] = '\0';
  cinfo->arith_dc_L[0xd] = '\0';
  cinfo->arith_dc_L[0xe] = '\0';
  cinfo->arith_dc_L[0xf] = '\0';
  builtin_memcpy(cinfo->arith_dc_U,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_memcpy(cinfo->arith_ac_K,
                 "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",0x10);
  cinfo->num_scans = 0;
  cinfo->scan_info = (jpeg_scan_info *)0x0;
  cinfo->raw_data_in = 0;
  cinfo->arith_code = 0;
  cinfo->optimize_coding = (uint)(8 < cinfo->data_precision);
  cinfo->CCIR601_sampling = 0;
  cinfo->smoothing_factor = 0;
  cinfo->dct_method = JDCT_ISLOW;
  cinfo->restart_interval = 0;
  cinfo->restart_in_rows = 0;
  cinfo->JFIF_major_version = '\x01';
  cinfo->JFIF_minor_version = '\x01';
  cinfo->density_unit = '\0';
  cinfo->X_density = 1;
  cinfo->Y_density = 1;
  jpeg_default_colorspace(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_defaults(j_compress_ptr cinfo)
{
  int i;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Allocate comp_info array large enough for maximum component count.
   * Array is made permanent in case application wants to compress
   * multiple images at same param settings.
   */
  if (cinfo->comp_info == NULL)
    cinfo->comp_info = (jpeg_component_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  MAX_COMPONENTS * sizeof(jpeg_component_info));

  /* Initialize everything not dependent on the color space */

#if JPEG_LIB_VERSION >= 70
  cinfo->scale_num = 1;         /* 1:1 scaling */
  cinfo->scale_denom = 1;
#endif
  cinfo->data_precision = BITS_IN_JSAMPLE;
  /* Set up two quantization tables using default quality of 75 */
  jpeg_set_quality(cinfo, 75, TRUE);
  /* Set up two Huffman tables */
  std_huff_tables((j_common_ptr)cinfo);

  /* Initialize default arithmetic coding conditioning */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    cinfo->arith_dc_L[i] = 0;
    cinfo->arith_dc_U[i] = 1;
    cinfo->arith_ac_K[i] = 5;
  }

  /* Default is no multiple-scan output */
  cinfo->scan_info = NULL;
  cinfo->num_scans = 0;

  /* Expect normal source image, not raw downsampled data */
  cinfo->raw_data_in = FALSE;

  /* Use Huffman coding, not arithmetic coding, by default */
  cinfo->arith_code = FALSE;

  /* By default, don't do extra passes to optimize entropy coding */
  cinfo->optimize_coding = FALSE;
  /* The standard Huffman tables are only valid for 8-bit data precision.
   * If the precision is higher, force optimization on so that usable
   * tables will be computed.  This test can be removed if default tables
   * are supplied that are valid for the desired precision.
   */
  if (cinfo->data_precision > 8)
    cinfo->optimize_coding = TRUE;

  /* By default, use the simpler non-cosited sampling alignment */
  cinfo->CCIR601_sampling = FALSE;

#if JPEG_LIB_VERSION >= 70
  /* By default, apply fancy downsampling */
  cinfo->do_fancy_downsampling = TRUE;
#endif

  /* No input smoothing */
  cinfo->smoothing_factor = 0;

  /* DCT algorithm preference */
  cinfo->dct_method = JDCT_DEFAULT;

  /* No restart markers */
  cinfo->restart_interval = 0;
  cinfo->restart_in_rows = 0;

  /* Fill in default JFIF marker parameters.  Note that whether the marker
   * will actually be written is determined by jpeg_set_colorspace.
   *
   * By default, the library emits JFIF version code 1.01.
   * An application that wants to emit JFIF 1.02 extension markers should set
   * JFIF_minor_version to 2.  We could probably get away with just defaulting
   * to 1.02, but there may still be some decoders in use that will complain
   * about that; saying 1.01 should minimize compatibility problems.
   */
  cinfo->JFIF_major_version = 1; /* Default JFIF version = 1.01 */
  cinfo->JFIF_minor_version = 1;
  cinfo->density_unit = 0;      /* Pixel size is unknown by default */
  cinfo->X_density = 1;         /* Pixel aspect ratio is square by default */
  cinfo->Y_density = 1;

  /* Choose JPEG colorspace based on input space, set defaults accordingly */

  jpeg_default_colorspace(cinfo);
}